

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O2

time_t Curl_pp_state_timeout(pingpong *pp,_Bool disconnecting)

{
  connectdata *pcVar1;
  Curl_easy *pCVar2;
  long lVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  timediff_t tVar8;
  long lVar9;
  long lVar10;
  curltime cVar11;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  
  pcVar1 = pp->conn;
  pCVar2 = pcVar1->data;
  lVar9 = (pCVar2->set).server_response_timeout;
  if (lVar9 == 0) {
    lVar9 = pp->response_time;
  }
  cVar11 = Curl_now();
  uVar4 = (pp->response).tv_sec;
  uVar5 = (pp->response).tv_usec;
  older.tv_usec = uVar5;
  older.tv_sec = uVar4;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar11._0_12_,0);
  newer.tv_usec = SUB124(cVar11._0_12_,8);
  older._12_4_ = 0;
  tVar8 = Curl_timediff(newer,older);
  lVar9 = lVar9 - tVar8;
  lVar3 = (pCVar2->set).timeout;
  lVar10 = lVar9;
  if (lVar3 != 0 && !disconnecting) {
    cVar11 = Curl_now();
    uVar6 = (pcVar1->now).tv_sec;
    uVar7 = (pcVar1->now).tv_usec;
    older_00.tv_usec = uVar7;
    older_00.tv_sec = uVar6;
    newer_00._12_4_ = 0;
    newer_00.tv_sec = SUB128(cVar11._0_12_,0);
    newer_00.tv_usec = SUB124(cVar11._0_12_,8);
    older_00._12_4_ = 0;
    tVar8 = Curl_timediff(newer_00,older_00);
    lVar10 = lVar3 - tVar8;
    if (lVar9 < lVar10) {
      lVar10 = lVar9;
    }
  }
  return lVar10;
}

Assistant:

time_t Curl_pp_state_timeout(struct pingpong *pp, bool disconnecting)
{
  struct connectdata *conn = pp->conn;
  struct Curl_easy *data = conn->data;
  time_t timeout_ms; /* in milliseconds */
  long response_time = (data->set.server_response_timeout)?
    data->set.server_response_timeout: pp->response_time;

  /* if CURLOPT_SERVER_RESPONSE_TIMEOUT is set, use that to determine
     remaining time, or use pp->response because SERVER_RESPONSE_TIMEOUT is
     supposed to govern the response for any given server response, not for
     the time from connect to the given server response. */

  /* Without a requested timeout, we only wait 'response_time' seconds for the
     full response to arrive before we bail out */
  timeout_ms = response_time -
    (time_t)Curl_timediff(Curl_now(), pp->response); /* spent time */

  if(data->set.timeout && !disconnecting) {
    /* if timeout is requested, find out how much remaining time we have */
    time_t timeout2_ms = data->set.timeout - /* timeout time */
      (time_t)Curl_timediff(Curl_now(), conn->now); /* spent time */

    /* pick the lowest number */
    timeout_ms = CURLMIN(timeout_ms, timeout2_ms);
  }

  return timeout_ms;
}